

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int csv_write_callback(jx9_value *pKey,jx9_value *pValue,void *pUserData)

{
  sxi32 sVar1;
  long lVar2;
  sxu32 local_44;
  int local_40;
  sxu32 n;
  int c2;
  int nLen;
  char *zData;
  csv_data *pData;
  void *pUserData_local;
  jx9_value *pValue_local;
  jx9_value *pKey_local;
  
  zData = (char *)pUserData;
  pData = (csv_data *)pUserData;
  pUserData_local = pValue;
  pValue_local = pKey;
  _c2 = jx9_value_to_string(pValue,(int *)&n);
  if ((int)n < 1) {
    pKey_local._4_4_ = 0;
  }
  else {
    if (0 < *(int *)(zData + 0x10)) {
      (**(code **)(**(long **)(zData + 8) + 0x40))
                (*(undefined8 *)(*(long *)(zData + 8) + 8),zData,1);
    }
    local_44 = 1;
    local_40 = 0;
    sVar1 = SyByteFind(_c2,n,*(sxi32 *)zData,(sxu32 *)0x0);
    if ((sVar1 == 0) || (sVar1 = SyByteFind(_c2,n,*(sxi32 *)(zData + 4),&local_44), sVar1 == 0)) {
      local_40 = 1;
      if (local_44 == 0) {
        local_40 = 2;
      }
      (**(code **)(**(long **)(zData + 8) + 0x40))
                (*(undefined8 *)(*(long *)(zData + 8) + 8),zData + 4,1);
      if (1 < local_40) {
        (**(code **)(**(long **)(zData + 8) + 0x40))
                  (*(undefined8 *)(*(long *)(zData + 8) + 8),zData + 4,1);
      }
    }
    lVar2 = (**(code **)(**(long **)(zData + 8) + 0x40))
                      (*(undefined8 *)(*(long *)(zData + 8) + 8),_c2,(long)(int)n);
    if (lVar2 < 1) {
      pKey_local._4_4_ = -10;
    }
    else {
      if ((0 < local_40) &&
         ((**(code **)(**(long **)(zData + 8) + 0x40))
                    (*(undefined8 *)(*(long *)(zData + 8) + 8),zData + 4,1), 1 < local_40)) {
        (**(code **)(**(long **)(zData + 8) + 0x40))
                  (*(undefined8 *)(*(long *)(zData + 8) + 8),zData + 4,1);
      }
      *(int *)(zData + 0x10) = *(int *)(zData + 0x10) + 1;
      pKey_local._4_4_ = 0;
    }
  }
  return pKey_local._4_4_;
}

Assistant:

static int csv_write_callback(jx9_value *pKey, jx9_value *pValue, void *pUserData)
{
	struct csv_data *pData = (struct csv_data *)pUserData;
	const char *zData;
	int nLen, c2;
	sxu32 n;
	/* Point to the raw data */
	zData = jx9_value_to_string(pValue, &nLen);
	if( nLen < 1 ){
		/* Nothing to write */
		return JX9_OK;
	}
	if( pData->iCount > 0 ){
		/* Write the delimiter */
		pData->pDev->pStream->xWrite(pData->pDev->pHandle, (const void *)&pData->delimiter, sizeof(char));
	}
	n = 1;
	c2 = 0;
	if( SyByteFind(zData, (sxu32)nLen, pData->delimiter, 0) == SXRET_OK || 
		SyByteFind(zData, (sxu32)nLen, pData->enclosure, &n) == SXRET_OK ){
			c2 = 1;
			if( n == 0 ){
				c2 = 2;
			}
			/* Write the enclosure */
			pData->pDev->pStream->xWrite(pData->pDev->pHandle, (const void *)&pData->enclosure, sizeof(char));
			if( c2 > 1 ){
				pData->pDev->pStream->xWrite(pData->pDev->pHandle, (const void *)&pData->enclosure, sizeof(char));
			}
	}
	/* Write the data */
	if( pData->pDev->pStream->xWrite(pData->pDev->pHandle, (const void *)zData, (jx9_int64)nLen) < 1 ){
		SXUNUSED(pKey); /* cc warning */
		return JX9_ABORT;
	}
	if( c2 > 0 ){
		/* Write the enclosure */
		pData->pDev->pStream->xWrite(pData->pDev->pHandle, (const void *)&pData->enclosure, sizeof(char));
		if( c2 > 1 ){
			pData->pDev->pStream->xWrite(pData->pDev->pHandle, (const void *)&pData->enclosure, sizeof(char));
		}
	}
	pData->iCount++;
	return JX9_OK;
}